

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<int,_fmt::v5::basic_format_specs<char>_> *this)

{
  locale_ref loc;
  long in_RDI;
  basic_format_specs<char> *unaff_retaddr;
  int in_stack_0000000c;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  num_writer in_stack_00000030;
  int size;
  char_type sep;
  int num_digits;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  internal::count_digits(*(uint32_t *)(in_RDI + 0x10));
  loc.locale_._4_4_ = in_stack_ffffffffffffff94;
  loc.locale_._0_4_ = in_stack_ffffffffffffff90;
  internal::thousands_sep<char>(loc);
  get_prefix((int_writer<int,_fmt::v5::basic_format_specs<char>_> *)0x10c390);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
            (in_stack_00000010,in_stack_0000000c,(string_view)in_stack_00000018,unaff_retaddr,
             in_stack_00000030);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }